

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5AppendPoslist(Fts5Index *p,i64 iDelta,Fts5Iter *pMulti,Fts5Buffer *pBuf)

{
  int iVar1;
  int iVar2;
  int local_34;
  int nByte;
  int nData;
  Fts5Buffer *pBuf_local;
  Fts5Iter *pMulti_local;
  i64 iDelta_local;
  Fts5Index *p_local;
  
  iVar1 = (pMulti->base).nData;
  if (p->rc == 0) {
    if ((uint)pBuf->nSpace < (uint)(pBuf->n + iVar1 + 0x1a)) {
      local_34 = sqlite3Fts5BufferSize(&p->rc,pBuf,iVar1 + 0x1a + pBuf->n);
    }
    else {
      local_34 = 0;
    }
    if (local_34 == 0) {
      iVar2 = sqlite3Fts5PutVarint(pBuf->p + pBuf->n,iDelta);
      pBuf->n = iVar2 + pBuf->n;
      iVar2 = sqlite3Fts5PutVarint(pBuf->p + pBuf->n,(long)(iVar1 << 1));
      pBuf->n = iVar2 + pBuf->n;
      memcpy(pBuf->p + pBuf->n,(pMulti->base).pData,(long)iVar1);
      pBuf->n = iVar1 + pBuf->n;
      memset(pBuf->p + pBuf->n,0,8);
    }
  }
  return;
}

Assistant:

static void fts5AppendPoslist(
  Fts5Index *p,
  i64 iDelta,
  Fts5Iter *pMulti,
  Fts5Buffer *pBuf
){
  int nData = pMulti->base.nData;
  int nByte = nData + 9 + 9 + FTS5_DATA_ZERO_PADDING;
  assert( nData>0 );
  if( p->rc==SQLITE_OK && 0==fts5BufferGrow(&p->rc, pBuf, nByte) ){
    fts5BufferSafeAppendVarint(pBuf, iDelta);
    fts5BufferSafeAppendVarint(pBuf, nData*2);
    fts5BufferSafeAppendBlob(pBuf, pMulti->base.pData, nData);
    memset(&pBuf->p[pBuf->n], 0, FTS5_DATA_ZERO_PADDING);
  }
}